

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

char * GetLevelError(void)

{
  size_t sVar1;
  char *__ptr;
  char *LocTemp;
  
  sVar1 = strlen(ErrorText);
  if (sVar1 == 0) {
    snprintf(ErrorText,0x400,"Unspecified error at line %d",(ulong)(uint)Lines);
  }
  __ptr = strdup(ErrorText);
  snprintf(ErrorText,0x400,"Level load - %s",__ptr);
  free(__ptr);
  return ErrorText;
}

Assistant:

char *GetLevelError(void)
{
   char *LocTemp;

   if (!strlen(ErrorText))
      snprintf(ErrorText, sizeof(ErrorText), "Unspecified error at line %d",
                Lines);

   LocTemp = strdup(ErrorText);
   snprintf(ErrorText, sizeof(ErrorText), "Level load - %s", LocTemp);
   free((void *)LocTemp);
   return ErrorText;
}